

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void dump_level_simple(char *basefilename,char *title,chunk_conflict *c)

{
  char *base;
  _Bool _Var1;
  ang_file *fo_00;
  char *local_460;
  char *local_458;
  char *local_448;
  ang_file *fo;
  char path [1024];
  chunk_conflict *c_local;
  char *title_local;
  char *basefilename_local;
  
  base = ANGBAND_DIR_USER;
  if (basefilename == (char *)0x0) {
    local_448 = "dumpedlevel.html";
  }
  else {
    local_448 = format("%s.html",basefilename);
  }
  path_build((char *)&fo,0x400,base,local_448);
  fo_00 = file_open((char *)&fo,MODE_WRITE,FTYPE_TEXT);
  if (fo_00 != (ang_file *)0x0) {
    local_458 = title;
    if (title == (char *)0x0) {
      local_458 = "Dumped Level";
    }
    dump_level(fo_00,local_458,c,(int **)0x0);
    _Var1 = file_close(fo_00);
    if (_Var1) {
      local_460 = basefilename;
      if (basefilename == (char *)0x0) {
        local_460 = "dumpedlevel";
      }
      msg("Level dumped to %s.html",local_460);
    }
  }
  return;
}

Assistant:

void dump_level_simple(const char *basefilename, const char *title,
	struct chunk *c)
{
	char path[1024];
	ang_file *fo;

	path_build(path, sizeof(path), ANGBAND_DIR_USER, (basefilename) ?
		format("%s.html", basefilename) : "dumpedlevel.html");
	fo = file_open(path, MODE_WRITE, FTYPE_TEXT);
	if (fo) {
		dump_level(fo, (title) ? title : "Dumped Level", c, NULL);
		if (file_close(fo)) {
			msg("Level dumped to %s.html",
				(basefilename) ? basefilename : "dumpedlevel");
		}
	}
}